

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O2

StorageIndex *
duckdb::GetStorageIndex
          (StorageIndex *__return_storage_ptr__,TableCatalogEntry *table,ColumnIndex *column_id)

{
  ColumnDefinition *this;
  storage_t *psVar1;
  
  if (column_id->index == 0xffffffffffffffff) {
    __return_storage_ptr__->index = 0xffffffffffffffff;
    (__return_storage_ptr__->child_indexes).
    super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->child_indexes).
    super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->child_indexes).
    super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    this = TableCatalogEntry::GetColumn(table,(LogicalIndex)column_id->index);
    TransformStorageIndex(__return_storage_ptr__,column_id);
    psVar1 = ColumnDefinition::StorageOid(this);
    __return_storage_ptr__->index = *psVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

static StorageIndex GetStorageIndex(TableCatalogEntry &table, const ColumnIndex &column_id) {
	if (column_id.IsRowIdColumn()) {
		return StorageIndex();
	}

	// The index of the base ColumnIndex is equal to the physical column index in the table
	// for any child indices because the indices are already the physical indices.
	// Only the top-level can have generated columns.
	auto &col = table.GetColumn(column_id.ToLogical());
	auto result = TransformStorageIndex(column_id);
	result.SetIndex(col.StorageOid());
	return result;
}